

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff::TransientCmdPoolRecycler::
~TransientCmdPoolRecycler(TransientCmdPoolRecycler *this)

{
  if (this->CmdPoolMgr != (CommandPoolManager *)0x0) {
    VulkanUtilities::VulkanLogicalDevice::FreeCommandBuffer
              (this->LogicalDevice,(this->Pool).m_VkObject,this->vkCmdBuffer);
    CommandPoolManager::RecycleCommandPool(this->CmdPoolMgr,&this->Pool);
  }
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  ~VulkanObjectWrapper(&this->Pool);
  return;
}

Assistant:

~TransientCmdPoolRecycler()
        {
            if (CmdPoolMgr != nullptr)
            {
                LogicalDevice.FreeCommandBuffer(Pool, vkCmdBuffer);
                CmdPoolMgr->RecycleCommandPool(std::move(Pool));
            }
        }